

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsDiv.c
# Opt level: O1

Vec_Ptr_t * Abc_MfsComputeDivisors(Mfs_Man_t *p,Abc_Obj_t *pNode,int nLevDivMax)

{
  undefined4 uVar1;
  uint uVar2;
  Abc_Ntk_t *pAVar3;
  long *plVar4;
  long lVar5;
  long *plVar6;
  void *pvVar7;
  int *piVar8;
  Vec_Ptr_t *pVVar9;
  Vec_Ptr_t *pVVar10;
  void **ppvVar11;
  void **ppvVar12;
  long lVar13;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar14;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int Fill;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar15;
  undefined8 extraout_RDX_02;
  ulong uVar16;
  uint uVar17;
  long *plVar18;
  uint uVar19;
  int iVar20;
  long lVar21;
  int iVar22;
  long lVar23;
  void **local_70;
  
  if (p->vDivs != (Vec_Ptr_t *)0x0) {
    __assert_fail("p->vDivs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/mfs/mfsDiv.c"
                  ,199,"Vec_Ptr_t *Abc_MfsComputeDivisors(Mfs_Man_t *, Abc_Obj_t *, int)");
  }
  pAVar3 = pNode->pNtk;
  if ((pAVar3->vTravIds).pArray == (int *)0x0) {
    iVar20 = pAVar3->vObjs->nSize;
    uVar16 = (long)iVar20 + 500;
    iVar14 = (int)uVar16;
    if ((pAVar3->vTravIds).nCap < iVar14) {
      piVar8 = (int *)malloc(uVar16 * 4);
      (pAVar3->vTravIds).pArray = piVar8;
      if (piVar8 == (int *)0x0) goto LAB_00446b72;
      (pAVar3->vTravIds).nCap = iVar14;
    }
    if (-500 < iVar20) {
      memset((pAVar3->vTravIds).pArray,0,(uVar16 & 0xffffffff) << 2);
    }
    (pAVar3->vTravIds).nSize = iVar14;
  }
  iVar20 = pAVar3->nTravIds;
  pAVar3->nTravIds = iVar20 + 1;
  if (iVar20 < 0x3fffffff) {
    pVVar9 = Abc_MfsWinMarkTfi(pNode);
    iVar20 = pVVar9->nSize;
    pAVar3 = pNode->pNtk;
    if ((pAVar3->vTravIds).pArray == (int *)0x0) {
      iVar14 = pAVar3->vObjs->nSize;
      uVar16 = (long)iVar14 + 500;
      iVar22 = (int)uVar16;
      if ((pAVar3->vTravIds).nCap < iVar22) {
        piVar8 = (int *)malloc(uVar16 * 4);
        (pAVar3->vTravIds).pArray = piVar8;
        if (piVar8 == (int *)0x0) {
LAB_00446b72:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        (pAVar3->vTravIds).nCap = iVar22;
      }
      if (-500 < iVar14) {
        memset((pAVar3->vTravIds).pArray,0,(uVar16 & 0xffffffff) << 2);
      }
      (pAVar3->vTravIds).nSize = iVar22;
    }
    iVar14 = pAVar3->nTravIds;
    pAVar3->nTravIds = iVar14 + 1;
    if (iVar14 < 0x3fffffff) {
      Abc_MfsWinSweepLeafTfo_rec(pNode,nLevDivMax);
      if (0 < (pNode->vFanins).nSize) {
        lVar21 = 0;
        uVar15 = extraout_RDX;
        do {
          plVar18 = (long *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar21]];
          lVar23 = *plVar18;
          uVar1 = *(undefined4 *)(lVar23 + 0xd8);
          iVar14 = (int)plVar18[2];
          Vec_IntFillExtra((Vec_Int_t *)(lVar23 + 0xe0),iVar14 + 1,(int)uVar15);
          if (((long)iVar14 < 0) || (*(int *)(lVar23 + 0xe4) <= iVar14)) {
LAB_00446b15:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          *(undefined4 *)(*(long *)(lVar23 + 0xe8) + (long)iVar14 * 4) = uVar1;
          lVar21 = lVar21 + 1;
          uVar15 = extraout_RDX_00;
        } while (lVar21 < (pNode->vFanins).nSize);
      }
      iVar14 = p->pPars->nWinMax;
      pVVar10 = (Vec_Ptr_t *)malloc(0x10);
      iVar22 = 8;
      if (6 < iVar14 - 1U) {
        iVar22 = iVar14;
      }
      pVVar10->nSize = 0;
      pVVar10->nCap = iVar22;
      if (iVar22 == 0) {
        ppvVar11 = (void **)0x0;
        iVar14 = extraout_EDX;
      }
      else {
        ppvVar11 = (void **)malloc((long)iVar22 << 3);
        iVar14 = extraout_EDX_00;
      }
      pVVar10->pArray = ppvVar11;
      if (iVar20 < 1) {
LAB_00446607:
        if (pVVar9->pArray != (void **)0x0) {
          free(pVVar9->pArray);
          pVVar9->pArray = (void **)0x0;
        }
        if (pVVar9 != (Vec_Ptr_t *)0x0) {
          free(pVVar9);
        }
        if (pVVar10->nSize < p->pPars->nWinMax) {
          uVar17 = pVVar10->nSize;
          if (0 < (int)uVar17) {
            local_70 = pVVar10->pArray;
            lVar21 = 0;
            do {
              plVar18 = (long *)local_70[lVar21];
              if (0 < *(int *)((long)plVar18 + 0x2c)) {
                lVar23 = 0;
                do {
                  lVar13 = (long)p->pPars->nFanoutsMax;
                  if (lVar13 != 0 && lVar13 < lVar23) break;
                  plVar4 = *(long **)(*(long *)(*(long *)(*plVar18 + 0x20) + 8) +
                                     (long)*(int *)(plVar18[6] + lVar23 * 4) * 8);
                  lVar13 = *plVar4;
                  iVar20 = (int)plVar4[2];
                  Vec_IntFillExtra((Vec_Int_t *)(lVar13 + 0xe0),iVar20 + 1,(int)plVar18);
                  if (((long)iVar20 < 0) || (*(int *)(lVar13 + 0xe4) <= iVar20)) {
LAB_00446acc:
                    pVVar10->pArray = local_70;
                    pVVar10->nSize = uVar17;
                    goto LAB_00446ae1;
                  }
                  lVar5 = *plVar4;
                  if (*(int *)(*(long *)(lVar13 + 0xe8) + (long)iVar20 * 4) !=
                      *(int *)(lVar5 + 0xd8) + -1) {
                    iVar20 = (int)plVar4[2];
                    Vec_IntFillExtra((Vec_Int_t *)(lVar5 + 0xe0),iVar20 + 1,Fill);
                    if (((long)iVar20 < 0) || (*(int *)(lVar5 + 0xe4) <= iVar20)) goto LAB_00446acc;
                    if ((*(int *)(*(long *)(lVar5 + 0xe8) + (long)iVar20 * 4) !=
                         *(int *)(*plVar4 + 0xd8)) &&
                       ((int)(*(uint *)((long)plVar4 + 0x14) >> 0xc) <= nLevDivMax &&
                        (*(uint *)((long)plVar4 + 0x14) & 0xf) == 7)) {
                      if (*(int *)((long)plVar4 + 0x1c) < 1) {
                        iVar20 = 0;
                      }
                      else {
                        lVar13 = 0;
                        uVar15 = extraout_RDX_01;
                        do {
                          plVar6 = *(long **)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                             (long)*(int *)(plVar4[4] + lVar13 * 4) * 8);
                          lVar5 = *plVar6;
                          iVar20 = (int)plVar6[2];
                          Vec_IntFillExtra((Vec_Int_t *)(lVar5 + 0xe0),iVar20 + 1,(int)uVar15);
                          if (((long)iVar20 < 0) || (*(int *)(lVar5 + 0xe4) <= iVar20))
                          goto LAB_00446acc;
                        } while ((*(int *)(*(long *)(lVar5 + 0xe8) + (long)iVar20 * 4) ==
                                  *(int *)(*plVar6 + 0xd8) + -1) &&
                                (lVar13 = lVar13 + 1, uVar15 = extraout_RDX_02,
                                lVar13 < *(int *)((long)plVar4 + 0x1c)));
                        iVar20 = (int)lVar13;
                      }
                      if (*(int *)((long)plVar4 + 0x1c) <= iVar20) {
                        uVar19 = pVVar10->nCap;
                        if (uVar17 == uVar19) {
                          if ((int)uVar19 < 0x10) {
                            if (local_70 == (void **)0x0) {
                              local_70 = (void **)malloc(0x80);
                            }
                            else {
                              local_70 = (void **)realloc(local_70,0x80);
                            }
                            iVar20 = 0x10;
                          }
                          else {
                            iVar20 = uVar19 * 2;
                            if (iVar20 <= (int)uVar19) goto LAB_0044688d;
                            if (local_70 == (void **)0x0) {
                              local_70 = (void **)malloc((ulong)uVar19 << 4);
                            }
                            else {
                              local_70 = (void **)realloc(local_70,(ulong)uVar19 << 4);
                            }
                          }
                          pVVar10->nCap = iVar20;
                        }
LAB_0044688d:
                        local_70[(int)uVar17] = plVar4;
                        pVVar9 = p->vNodes;
                        uVar19 = pVVar9->nSize;
                        if (0 < (long)(int)uVar19) {
                          uVar16 = 0;
                          do {
                            if ((long *)pVVar9->pArray[uVar16] == plVar4) goto LAB_00446940;
                            uVar16 = uVar16 + 1;
                          } while ((long)(int)uVar19 != uVar16);
                        }
                        uVar2 = pVVar9->nCap;
                        if (uVar19 == uVar2) {
                          if ((int)uVar2 < 0x10) {
                            if (pVVar9->pArray == (void **)0x0) {
                              ppvVar11 = (void **)malloc(0x80);
                            }
                            else {
                              ppvVar11 = (void **)realloc(pVVar9->pArray,0x80);
                            }
                            pVVar9->pArray = ppvVar11;
                            iVar20 = 0x10;
                          }
                          else {
                            iVar20 = uVar2 * 2;
                            if (iVar20 <= (int)uVar2) goto LAB_0044692d;
                            if (pVVar9->pArray == (void **)0x0) {
                              ppvVar11 = (void **)malloc((ulong)uVar2 << 4);
                            }
                            else {
                              ppvVar11 = (void **)realloc(pVVar9->pArray,(ulong)uVar2 << 4);
                            }
                            pVVar9->pArray = ppvVar11;
                          }
                          pVVar9->nCap = iVar20;
                        }
LAB_0044692d:
                        iVar20 = pVVar9->nSize;
                        uVar19 = iVar20 + 1;
                        uVar16 = (ulong)uVar19;
                        pVVar9->nSize = uVar19;
                        pVVar9->pArray[iVar20] = plVar4;
LAB_00446940:
                        uVar17 = uVar17 + 1;
                        lVar13 = *plVar4;
                        iVar20 = *(int *)(lVar13 + 0xd8);
                        iVar14 = (int)plVar4[2];
                        Vec_IntFillExtra((Vec_Int_t *)(lVar13 + 0xe0),iVar14 + 1,(int)uVar16);
                        if (((long)iVar14 < 0) || (*(int *)(lVar13 + 0xe4) <= iVar14)) {
                          pVVar10->pArray = local_70;
                          pVVar10->nSize = uVar17;
                          goto LAB_00446b15;
                        }
                        *(int *)(*(long *)(lVar13 + 0xe8) + (long)iVar14 * 4) = iVar20 + -1;
                        if (p->pPars->nWinMax <= (int)uVar17) break;
                      }
                    }
                  }
                  lVar23 = lVar23 + 1;
                } while (lVar23 < *(int *)((long)plVar18 + 0x2c));
              }
            } while (((int)uVar17 < p->pPars->nWinMax) &&
                    (lVar21 = lVar21 + 1, lVar21 < (int)uVar17));
            pVVar10->pArray = local_70;
          }
          pVVar10->nSize = uVar17;
        }
        uVar17 = pVVar10->nSize;
        p->nMaxDivs = p->nMaxDivs + (uint)(p->pPars->nWinMax <= (int)uVar17);
        if (1 < (int)uVar17) {
          qsort(pVVar10->pArray,(ulong)uVar17,8,Abc_NodeCompareLevelsIncrease);
        }
        if (0 < (pNode->vFanins).nSize) {
          uVar17 = pVVar10->nCap;
          iVar20 = pVVar10->nSize;
          ppvVar11 = pVVar10->pArray;
          lVar21 = 0;
          do {
            pvVar7 = pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar21]];
            if (iVar20 + (int)lVar21 == uVar17) {
              if ((int)uVar17 < 0x10) {
                if (ppvVar11 == (void **)0x0) {
                  ppvVar11 = (void **)malloc(0x80);
                }
                else {
                  ppvVar11 = (void **)realloc(ppvVar11,0x80);
                }
                uVar17 = 0x10;
              }
              else {
                uVar19 = uVar17 * 2;
                if (SBORROW4(uVar17,uVar19) != 0 < (int)uVar17) {
                  uVar17 = uVar19;
                  if (ppvVar11 == (void **)0x0) {
                    ppvVar11 = (void **)malloc((ulong)uVar19 << 3);
                  }
                  else {
                    ppvVar11 = (void **)realloc(ppvVar11,(ulong)uVar19 << 3);
                  }
                }
              }
            }
            ppvVar11[iVar20 + lVar21] = pvVar7;
            lVar21 = lVar21 + 1;
          } while (lVar21 < (pNode->vFanins).nSize);
          pVVar10->nSize = iVar20 + (int)lVar21;
          pVVar10->nCap = uVar17;
          pVVar10->pArray = ppvVar11;
        }
        return pVVar10;
      }
      ppvVar11 = pVVar9->pArray;
      plVar18 = (long *)*ppvVar11;
      lVar21 = *plVar18;
      uVar17 = *(uint *)(plVar18 + 2);
      Vec_IntFillExtra((Vec_Int_t *)(lVar21 + 0xe0),uVar17 + 1,iVar14);
      if (-1 < (int)uVar17) {
        uVar19 = 0;
        do {
          if (*(int *)(lVar21 + 0xe4) <= (int)uVar17) break;
          iVar14 = *(int *)(*plVar18 + 0xd8) + -1;
          if ((*(int *)(*(long *)(lVar21 + 0xe8) + (ulong)uVar17 * 4) == iVar14) &&
             ((int)(*(uint *)((long)plVar18 + 0x14) >> 0xc) <= nLevDivMax)) {
            uVar17 = pVVar10->nSize;
            uVar2 = pVVar10->nCap;
            if (uVar17 == uVar2) {
              if ((int)uVar2 < 0x10) {
                if (pVVar10->pArray == (void **)0x0) {
                  ppvVar12 = (void **)malloc(0x80);
                  iVar14 = extraout_EDX_03;
                }
                else {
                  ppvVar12 = (void **)realloc(pVVar10->pArray,0x80);
                  iVar14 = extraout_EDX_01;
                }
                iVar22 = 0x10;
              }
              else {
                iVar22 = uVar2 * 2;
                if (iVar22 <= (int)uVar2) goto LAB_004465ab;
                if (pVVar10->pArray == (void **)0x0) {
                  ppvVar12 = (void **)malloc((ulong)uVar2 << 4);
                  iVar14 = extraout_EDX_04;
                }
                else {
                  ppvVar12 = (void **)realloc(pVVar10->pArray,(ulong)uVar2 << 4);
                  iVar14 = extraout_EDX_02;
                }
              }
              pVVar10->pArray = ppvVar12;
              pVVar10->nCap = iVar22;
            }
LAB_004465ab:
            pVVar10->nSize = uVar17 + 1;
            pVVar10->pArray[(int)uVar17] = plVar18;
            if (p->pPars->nWinMax <= (int)(uVar17 + 1)) goto LAB_00446607;
          }
          uVar19 = uVar19 + 1;
          if (iVar20 <= (int)uVar19) goto LAB_00446607;
          plVar18 = (long *)ppvVar11[uVar19];
          lVar21 = *plVar18;
          uVar17 = *(uint *)(plVar18 + 2);
          Vec_IntFillExtra((Vec_Int_t *)(lVar21 + 0xe0),uVar17 + 1,iVar14);
        } while (-1 < (int)uVar17);
      }
LAB_00446ae1:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                ,0x197,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

Vec_Ptr_t * Abc_MfsComputeDivisors( Mfs_Man_t * p, Abc_Obj_t * pNode, int nLevDivMax )
{
    Vec_Ptr_t * vCone, * vDivs;
    Abc_Obj_t * pObj, * pFanout, * pFanin;
    int k, f, m;
    int nDivsPlus = 0, nTrueSupp;
    assert( p->vDivs == NULL );

    // mark the TFI with the current trav ID
    Abc_NtkIncrementTravId( pNode->pNtk );
    vCone = Abc_MfsWinMarkTfi( pNode );

    // count the number of PIs
    nTrueSupp = 0;
    Vec_PtrForEachEntry( Abc_Obj_t *, vCone, pObj, k )
        nTrueSupp += Abc_ObjIsCi(pObj);
//    printf( "%d(%d) ", Vec_PtrSize(p->vSupp), m );

    // mark with the current trav ID those nodes that should not be divisors:
    // (1) the node and its TFO
    // (2) the MFFC of the node
    // (3) the node's fanins (these are treated as a special case)
    Abc_NtkIncrementTravId( pNode->pNtk );
    Abc_MfsWinSweepLeafTfo_rec( pNode, nLevDivMax );
//    Abc_MfsWinVisitMffc( pNode );
    Abc_ObjForEachFanin( pNode, pObj, k )
        Abc_NodeSetTravIdCurrent( pObj );

    // at this point the nodes are marked with two trav IDs:
    // nodes to be collected as divisors are marked with previous trav ID
    // nodes to be avoided as divisors are marked with current trav ID

    // start collecting the divisors
    vDivs = Vec_PtrAlloc( p->pPars->nWinMax );
    Vec_PtrForEachEntry( Abc_Obj_t *, vCone, pObj, k )
    {
        if ( !Abc_NodeIsTravIdPrevious(pObj) )
            continue;
        if ( (int)pObj->Level > nLevDivMax )
            continue;
        Vec_PtrPush( vDivs, pObj );
        if ( Vec_PtrSize(vDivs) >= p->pPars->nWinMax )
            break;
    }
    Vec_PtrFree( vCone );

    // explore the fanouts of already collected divisors
    if ( Vec_PtrSize(vDivs) < p->pPars->nWinMax )
    Vec_PtrForEachEntry( Abc_Obj_t *, vDivs, pObj, k )
    {
        // consider fanouts of this node
        Abc_ObjForEachFanout( pObj, pFanout, f )
        {
            // stop if there are too many fanouts
            if ( p->pPars->nFanoutsMax && f > p->pPars->nFanoutsMax )
                break;
            // skip nodes that are already added
            if ( Abc_NodeIsTravIdPrevious(pFanout) )
                continue;
            // skip nodes in the TFO or in the MFFC of node
            if ( Abc_NodeIsTravIdCurrent(pFanout) )
                continue;
            // skip COs
            if ( !Abc_ObjIsNode(pFanout) ) 
                continue;
            // skip nodes with large level
            if ( (int)pFanout->Level > nLevDivMax )
                continue;
            // skip nodes whose fanins are not divisors  -- here we skip more than we need to skip!!! (revise later)  August 7, 2009
            Abc_ObjForEachFanin( pFanout, pFanin, m )
                if ( !Abc_NodeIsTravIdPrevious(pFanin) )
                    break;
            if ( m < Abc_ObjFaninNum(pFanout) )
                continue;
            // make sure this divisor in not among the nodes
//            Vec_PtrForEachEntry( Abc_Obj_t *, p->vNodes, pFanin, m )
//                assert( pFanout != pFanin );
            // add the node to the divisors
            Vec_PtrPush( vDivs, pFanout );
//            Vec_PtrPush( p->vNodes, pFanout );
            Vec_PtrPushUnique( p->vNodes, pFanout );
            Abc_NodeSetTravIdPrevious( pFanout );
            nDivsPlus++;
            if ( Vec_PtrSize(vDivs) >= p->pPars->nWinMax )
                break;
        }
        if ( Vec_PtrSize(vDivs) >= p->pPars->nWinMax )
            break;
    }
    p->nMaxDivs += (Vec_PtrSize(vDivs) >= p->pPars->nWinMax);

    // sort the divisors by level in the increasing order
    Vec_PtrSort( vDivs, (int (*)(void))Abc_NodeCompareLevelsIncrease );

    // add the fanins of the node
    Abc_ObjForEachFanin( pNode, pFanin, k )
        Vec_PtrPush( vDivs, pFanin );

/*
    printf( "Node level = %d.  ", Abc_ObjLevel(p->pNode) );
    Vec_PtrForEachEntryStart( Abc_Obj_t *, vDivs, pObj, k, Vec_PtrSize(vDivs)-p->nDivsPlus )
        printf( "%d ", Abc_ObjLevel(pObj) );
    printf( "\n" );
*/
//printf( "%d ", p->nDivsPlus );
//    printf( "(%d+%d)(%d+%d+%d) ", Vec_PtrSize(p->vSupp), Vec_PtrSize(p->vNodes), 
//        nTrueSupp, Vec_PtrSize(vDivs)-nTrueSupp-nDivsPlus, nDivsPlus );
    return vDivs;
}